

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFV.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HFV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HFV *this,
          size_t address)

{
  Mapper *this_00;
  size_t sVar1;
  iterator iVar2;
  ssize_t sVar3;
  stat *psVar4;
  _Rb_tree_header *__nbytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  FileHolder *this_02;
  long source_address;
  size_t local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  
  local_60 = address;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&(this->writes_)._M_t,&local_60);
  sVar1 = local_60;
  __nbytes = &(this->writes_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != __nbytes) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar2._M_node[1]._M_parent)
    ;
    return __return_storage_ptr__;
  }
  this_00 = &this->mapper_;
  sVar3 = Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>
          ::non_volume_blocks(this_00);
  source_address = sVar1 - sVar3;
  if (-1 < source_address) {
    this_02 = &this->file_;
    psVar4 = FileHolder::stats(this_02);
    if ((ulong)(source_address * 0x200) < (ulong)psVar4->st_size) {
      FileHolder::seek(this_02,source_address * 0x200,0);
      FileHolder::read((FileHolder *)&stack0xffffffffffffffc0,(int)this_02,(void *)0x200,
                       (size_t)__nbytes);
      Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
      convert_source_block
                (__return_storage_ptr__,this_00,source_address,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffc0);
      this_01 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                &stack0xffffffffffffffc0;
      goto LAB_003e6fad;
    }
  }
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
  convert_source_block
            (__return_storage_ptr__,this_00,source_address,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  this_01 = &local_58;
LAB_003e6fad:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_01);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HFV::get_block(size_t address) {
	const auto written = writes_.find(address);
	if(written != writes_.end()) return written->second;

	const auto source_address = mapper_.to_source_address(address);
	if(source_address >= 0 && size_t(source_address)*get_block_size() < size_t(file_.stats().st_size)) {
		const long file_offset = long(get_block_size()) * long(source_address);
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}